

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

double interp_cubic(double *p,double x)

{
  double x_local;
  double *p_local;
  
  return x * 0.5 * (x * (x * (((p[1] - p[2]) * 3.0 + p[3]) - *p) +
                        ((p[2] * 4.0 + *p + *p + -(p[1] * 5.0)) - p[3])) + (p[2] - *p)) + p[1];
}

Assistant:

static double interp_cubic(const double *p, double x) {
  return p[1] + 0.5 * x *
                    (p[2] - p[0] +
                     x * (2.0 * p[0] - 5.0 * p[1] + 4.0 * p[2] - p[3] +
                          x * (3.0 * (p[1] - p[2]) + p[3] - p[0])));
}